

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::insert_edge
          (PolyConnectivity *this,HalfedgeHandle _prev_heh,HalfedgeHandle _next_heh)

{
  FaceHandle FVar1;
  BaseHandle BVar2;
  VertexHandle _start_vh;
  HalfedgeHandle HVar3;
  HalfedgeHandle _heh;
  value_type _heh_00;
  FaceHandle _fh;
  BaseHandle BVar4;
  Face *pFVar5;
  Halfedge *pHVar6;
  HalfedgeHandle _nheh;
  undefined1 local_58 [8];
  FaceHalfedgeIter fh_it;
  
  FVar1 = ArrayKernel::face_handle(&this->super_ArrayKernel,_prev_heh);
  BVar2.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_next_heh);
  if (FVar1.super_BaseHandle.idx_ != (BaseHandle)BVar2.idx_) {
    __assert_fail("face_handle(_prev_heh) == face_handle(_next_heh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3d2,
                  "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
                 );
  }
  BVar2.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_prev_heh);
  if ((BaseHandle)BVar2.idx_ != _next_heh.super_BaseHandle.idx_) {
    _start_vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,_prev_heh);
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,_next_heh);
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = (int)_start_vh;
    BVar2.idx_ = (int)ArrayKernel::new_edge
                                (&this->super_ArrayKernel,_start_vh,
                                 (VertexHandle)
                                 fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                                 _20_4_);
    _nheh.super_BaseHandle.idx_ = (BaseHandle)((-(BVar2.idx_ & 1U) | 1) + BVar2.idx_);
    HVar3 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_prev_heh);
    _heh = ArrayKernel::prev_halfedge_handle
                     (&this->super_ArrayKernel,_next_heh.super_BaseHandle.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,_prev_heh,(HalfedgeHandle)BVar2.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)BVar2.idx_,_next_heh);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_nheh,HVar3);
    FVar1 = ArrayKernel::new_face(&this->super_ArrayKernel);
    pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,FVar1);
    (pFVar5->halfedge_handle_).super_BaseHandle.idx_ = BVar2.idx_;
    fh_iter((FaceHalfedgeIter *)local_58,this,FVar1);
    while ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      _heh_00 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator*((FaceHalfedgeIter *)local_58);
      pHVar6 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.super_BaseHandle.idx_);
      (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)FVar1.super_BaseHandle.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((FaceHalfedgeIter *)local_58);
    }
    _fh = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar3);
    pHVar6 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh);
    (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)_fh.super_BaseHandle.idx_;
    if (_fh.super_BaseHandle.idx_ != -1) {
      HVar3 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_fh);
      BVar4.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,HVar3);
      if ((BaseHandle)BVar4.idx_ == FVar1.super_BaseHandle.idx_) {
        pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
        (pFVar5->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
      }
    }
    adjust_outgoing_halfedge
              (this,(VertexHandle)
                    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
    adjust_outgoing_halfedge
              (this,(VertexHandle)
                    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
    return (BaseHandle)(BaseHandle)BVar2.idx_;
  }
  __assert_fail("next_halfedge_handle(_prev_heh) != _next_heh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x3d3,
                "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
               );
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::insert_edge(HalfedgeHandle _prev_heh, HalfedgeHandle _next_heh)
{
  assert(face_handle(_prev_heh) == face_handle(_next_heh));//only the manifold case
  assert(next_halfedge_handle(_prev_heh) != _next_heh);//this can not be done
  VertexHandle vh0 = to_vertex_handle(_prev_heh);
  VertexHandle vh1 = from_vertex_handle(_next_heh);
  //create the link between vh0 and vh1
  HalfedgeHandle heh0 = new_edge(vh0, vh1);
  HalfedgeHandle heh1 = opposite_halfedge_handle(heh0);
  HalfedgeHandle next_prev_heh = next_halfedge_handle(_prev_heh);
  HalfedgeHandle prev_next_heh = prev_halfedge_handle(_next_heh);
  set_next_halfedge_handle(_prev_heh, heh0);
  set_next_halfedge_handle(heh0, _next_heh);
  set_next_halfedge_handle(prev_next_heh, heh1);
  set_next_halfedge_handle(heh1, next_prev_heh);
  
  //now set the face handles - the new face is assigned to heh0
  FaceHandle new_fh = new_face();
  set_halfedge_handle(new_fh, heh0);
  for (FaceHalfedgeIter fh_it = fh_iter(new_fh); fh_it.is_valid(); ++fh_it)
  {
    set_face_handle(*fh_it, new_fh);
  }  
  FaceHandle old_fh = face_handle(next_prev_heh);
  set_face_handle(heh1, old_fh);   
  if (old_fh.is_valid() && face_handle(halfedge_handle(old_fh)) == new_fh)
  {//fh pointed to one of the halfedges now assigned to new_fh
    set_halfedge_handle(old_fh, heh1);
  }
  adjust_outgoing_halfedge(vh0);  
  adjust_outgoing_halfedge(vh1);  
  return heh0;
}